

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O0

bool __thiscall RangeSize::propagate(RangeSize *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  Reason *in_RDI;
  Reason m_r_1;
  int64_t m_v_1;
  Reason m_r;
  int64_t m_v;
  int64_t in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffb0;
  Lit p;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  anon_union_8_2_743a5d44_for_Reason_0 local_20;
  undefined8 local_18;
  
  p.x = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  iVar2 = IntVar::getMin((IntVar *)0x27486c);
  if (iVar2 < 1) {
    local_18 = 1;
    bVar1 = IntVar::setMinNotR((IntVar *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98);
    if (bVar1) {
      Reason::Reason((Reason *)&local_20,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        (**(code **)(*(long *)in_RDI[4].field_0._pt + 0x40))();
        Reason::Reason(in_RDI,p);
      }
      uVar6 = (**(code **)(*(long *)in_RDI[4].field_0._pt + 0x70))
                        (in_RDI[4].field_0._pt,1,local_20._pt,1);
      if ((uVar6 & 1) == 0) {
        return false;
      }
    }
  }
  iVar2 = IntVar::getMax((IntVar *)0x274921);
  iVar3 = IntVar::getMin((IntVar *)0x274935);
  bVar1 = IntVar::setMaxNotR((IntVar *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                             in_stack_ffffffffffffff98);
  if (bVar1) {
    Reason::Reason((Reason *)&stack0xffffffffffffffc0,(Clause *)0x0);
    if ((so.lazy & 1U) != 0) {
      uVar4 = (**(code **)(*(long *)in_RDI[3].field_0._pt + 0x40))();
      uVar5 = (**(code **)(*(long *)in_RDI[3].field_0._pt + 0x48))();
      Reason::Reason((Reason *)CONCAT44(uVar4,uVar5),(Lit)in_stack_ffffffffffffffc4,
                     (Lit)in_stack_ffffffffffffffc0);
    }
    uVar6 = (**(code **)(*(long *)in_RDI[4].field_0._pt + 0x78))
                      (in_RDI[4].field_0._pt,(long)((iVar2 - iVar3) + 1),
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),1);
    if ((uVar6 & 1) == 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		if (y->getMin() < 1) {
			setDom((*y), setMin, 1, y->getMinLit());
		}
		setDom((*y), setMax, x->getMax() - x->getMin() + 1, x->getMinLit(), x->getMaxLit());
		return true;
	}